

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

void __thiscall Logger::LogError(Logger *this,string *stringForLogError)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&this->loggerPath,"/errors");
  std::ofstream::open((string *)&this->loggerFile,(_Ios_Openmode)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  poVar1 = std::operator<<((ostream *)&this->loggerFile,"--ERROR--");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)stringForLogError);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::close();
  return;
}

Assistant:

void LogError(string stringForLogError) {
        loggerFile.open(this->loggerPath + "/errors", ios_base::app);
        loggerFile << "--ERROR--" << " " << stringForLogError << endl;
        loggerFile.close();
    }